

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::writeDataToTexture
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  _Alloc_hider _Var1;
  int iVar2;
  GLenum GVar3;
  ostream *poVar4;
  size_t sVar5;
  TestError *this_01;
  int iVar6;
  size_type __new_size;
  long lVar7;
  SparseTextureClampLookupColorTestCase *this_02;
  SparseTextureClampLookupColorTestCase *pSVar8;
  GLint depth;
  GLint height;
  GLint width;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  ShaderProgram program;
  TokenStrings s;
  GLuint local_3e8;
  GLenum local_3e4;
  int local_3e0;
  GLint local_3dc;
  SparseTextureClampLookupColorTestCase *local_3d8;
  GLenum local_3cc;
  GLuint local_3c8;
  GLuint local_3c4;
  ostream *local_3c0;
  string local_3b8;
  string local_398;
  string local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_358;
  GLuint *local_338;
  string local_330;
  undefined1 local_310 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  pointer local_298;
  GLuint local_278;
  bool local_250;
  undefined1 local_240 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1b0;
  undefined1 local_190 [32];
  undefined1 local_170 [192];
  _Alloc_hider local_b0;
  _Alloc_hider local_50;
  
  this_00 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.field_0x88;
  local_3e4 = format;
  local_338 = texture;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Fill Texture with shader [level: ",0x21);
  local_3c0 = (ostream *)this_00;
  poVar4 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] - ",4);
  if (level <= (this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.levels + -1) {
    local_3e0 = target;
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState,level,(GLint *)&local_3c4,
               (GLint *)&local_3c8,(GLint *)&local_3e8);
    if ((0 < (int)local_3c8 && 0 < (int)local_3c4) &&
       ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth
        <= (int)local_3e8)) {
      if (local_3e0 == 0x8513) {
        local_3e8 = local_3e8 * 6;
      }
      iVar6 = local_3c8 * local_3c4 * local_3e8;
      local_3dc = level;
      iVar2 = tcu::TextureFormat::getPixelSize
                        (&(this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                          super_SparseTextureCommitmentTestCase.mState.format);
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(iVar2 * iVar6);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_358,__new_size);
      memset(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      if (0 < (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mState.samples) {
        local_3cc = 0x822a;
        if (local_3e4 != 0x81a5) {
          local_3cc = local_3e4;
        }
        iVar2 = 0;
        local_3d8 = this;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8,stc_compute_textureFill,(allocator<char> *)local_170);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"image","");
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"image","");
          pSVar8 = local_3d8;
          SparseTexture2CommitmentTestCase::createShaderTokens
                    ((TokenStrings *)local_170,(SparseTexture2CommitmentTestCase *)local_3d8,
                     local_3e0,local_3e4,iVar2,&local_398,&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          this_02 = (SparseTextureClampLookupColorTestCase *)local_170._160_8_;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_378,local_170._160_8_,
                     (pointer)(local_170._160_8_ + local_170._168_8_));
          generateExpectedResult((string *)local_240,this_02,&local_378,local_3dc);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)local_240);
          if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
            operator_delete((void *)local_240._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_240._16_8_)->_M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<INPUT_TYPE>",(GLchar *)local_170._128_8_,&local_3b8);
          replaceToken("<POINT_TYPE>",(GLchar *)local_170._32_8_,&local_3b8);
          replaceToken("<POINT_DEF>",(GLchar *)local_170._64_8_,&local_3b8);
          replaceToken("<RETURN_TYPE>",(GLchar *)local_170._160_8_,&local_3b8);
          replaceToken("<RESULT_EXPECTED>",local_b0._M_p,&local_3b8);
          replaceToken("<SAMPLE_DEF>",local_50._M_p,&local_3b8);
          local_190[0x10] = 0;
          local_190._17_8_ = 0;
          local_190._0_8_ = (pointer)0x0;
          local_190[8] = 0;
          local_190._9_7_ = 0;
          memset((ProgramSources *)local_240,0,0xac);
          local_310._0_4_ = 5;
          local_310._8_8_ = local_2f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_310 + 8),local_3b8._M_dataplus._M_p,
                     local_3b8._M_dataplus._M_p + local_3b8._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_240 + (ulong)(uint)local_310._0_4_ * 0x18),
                      (value_type *)(local_310 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._8_8_ != local_2f8) {
            operator_delete((void *)local_310._8_8_,local_2f8[0]._M_allocated_capacity + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)local_310,
                     ((pSVar8->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx,
                     (ProgramSources *)local_240);
          if (local_250 == true) {
            (*gl->useProgram)(local_278);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x2e1);
            (*gl->bindImageTexture)(0,*local_338,local_3dc,'\0',0,0x88b9,local_3cc);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x2e4);
            (*gl->uniform1i)(1,0);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x2e6);
            (*gl->dispatchCompute)(local_3c4,local_3c8,local_3e8);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x2e8);
            (*gl->memoryBarrier)(0xffffffff);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x2ea);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3c0,"Compute shader compilation failed (writing) for target: ",0x38);
            poVar4 = (ostream *)std::ostream::operator<<(local_3c0,local_3e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", format: ",10);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3e4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", sample: ",10);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", infoLog: ",0xb);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,((*local_298)->m_info).infoLog._M_dataplus._M_p,
                                ((*local_298)->m_info).infoLog._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", shaderSource: ",0x10);
            _Var1._M_p = local_3b8._M_dataplus._M_p;
            if (local_3b8._M_dataplus._M_p == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
            }
            else {
              sVar5 = strlen(local_3b8._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var1._M_p,sVar5);
            }
            pSVar8 = local_3d8;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_310);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_1b0);
          lVar7 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_240 + lVar7));
            lVar7 = lVar7 + -0x18;
          } while (lVar7 != -0x18);
          SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings((TokenStrings *)local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < (pSVar8->super_SparseTextureClampLookupResidencyTestCase).
                         super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                         super_SparseTextureCommitmentTestCase.mState.samples);
      }
      if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    return true;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x2b0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTextureClampLookupColorTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
															   GLuint& texture, GLint level)
{
	mLog << "Fill Texture with shader [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			std::string shader = stc_compute_textureFill;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			GLint convFormat = format;
			if (format == GL_DEPTH_COMPONENT16)
				convFormat = GL_R16;

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
									GL_WRITE_ONLY, convFormat);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
			}
			else
			{
				mLog << "Compute shader compilation failed (writing) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";
			}
		}
	}

	return true;
}